

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O3

RK_S32 mpi_enc_opt_ini(void *ctx,char *next)

{
  size_t __n;
  char *__dest;
  dictionary *pdVar1;
  
  if ((next != (char *)0x0) && (__n = strnlen(next,0x100), __n != 0)) {
    __dest = (char *)mpp_osal_calloc("mpi_enc_opt_ini",__n + 1);
    *(char **)((long)ctx + 0x10) = __dest;
    strncpy(__dest,next,__n);
    pdVar1 = iniparser_load(*(char **)((long)ctx + 0x10));
    *(dictionary **)((long)ctx + 0x18) = pdVar1;
    return 1;
  }
  _mpp_log_l(2,"mpi_enc_utils","input ini file is invalid\n",0);
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_ini(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        size_t len = strnlen(next, MAX_FILE_NAME_LENGTH);
        if (len) {
            cmd->file_cfg = mpp_calloc(char, len + 1);
            strncpy(cmd->file_cfg, next, len);
            cmd->cfg_ini = iniparser_load(cmd->file_cfg);

            return 1;
        }
    }

    mpp_err("input ini file is invalid\n");
    return 0;
}